

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O2

void __thiscall
Lib::Exception::
Exception<char_const*,char_const*,char_const*,std::__cxx11::string,char_const*,unsigned_int>
          (Exception *this,char *msg,char *msg_1,char *msg_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *msg_3,char *msg_4,
          uint msg_5)

{
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)msg_3);
  toString<char_const*,char_const*,char_const*,std::__cxx11::string,char_const*,unsigned_int>
            (&local_70,this,msg,msg_1,msg_2,&local_50,msg_4,msg_5);
  Exception(this,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

explicit Exception(Msg... msg)
   : Exception(toString(msg...))
  { }